

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

optional<tinyusdz::Variability> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::Variability>
          (optional<tinyusdz::Variability> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::Variability> local_20;
  CrateValue *local_18;
  CrateValue *this_local;
  
  local_18 = this;
  this_local = (CrateValue *)__return_storage_ptr__;
  tinyusdz::value::Value::get_value<tinyusdz::Variability>(&local_20,&this->value_,false);
  nonstd::optional_lite::optional<tinyusdz::Variability>::optional<tinyusdz::Variability,_0>
            (__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<tinyusdz::Variability>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }